

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

void __thiscall
Catch::UnaryExpr<bool>::streamReconstructedExpression(UnaryExpr<bool> *this,ostream *os)

{
  long local_28;
  char local_20 [16];
  
  if ((this->super_ITransientExpression).field_0xa == '\x01') {
    builtin_strncpy(local_20,"true",5);
    local_28 = 4;
  }
  else {
    builtin_strncpy(local_20,"false",6);
    local_28 = 5;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,local_20,local_28);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }